

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O3

void __thiscall SharedDirectory::delete_file(SharedDirectory *this,string *name)

{
  pointer pcVar1;
  bool bVar2;
  long lVar3;
  iterator __position;
  Error *pEVar4;
  path p;
  undefined1 local_68 [8];
  path local_60;
  string local_40;
  
  bVar2 = can_read_file(this,name);
  if (!bVar2) {
    pEVar4 = (Error *)__cxa_allocate_exception(0x3f0);
    Error::Error(pEVar4,"The file is not deletable");
    __cxa_throw(pEVar4,&Error::typeinfo,std::exception::~exception);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + name->_M_string_length);
  path_in_dir(&local_60,this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  boost::filesystem::detail::status((path *)local_68,(error_code *)&local_60);
  if (1 < (uint)local_68._0_4_) {
    lVar3 = boost::filesystem::detail::file_size(&local_60,(error_code *)0x0);
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)this,name);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                        *)this,__position);
    this->remaining_space = this->remaining_space + lVar3;
    boost::filesystem::detail::remove(&local_60,(error_code *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.m_pathname._M_dataplus._M_p != &local_60.m_pathname.field_2) {
      operator_delete(local_60.m_pathname._M_dataplus._M_p,local_60.m_pathname.field_2._0_8_ + 1);
    }
    return;
  }
  pEVar4 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(pEVar4,"The file does not exist");
  __cxa_throw(pEVar4,&Error::typeinfo,std::exception::~exception);
}

Assistant:

void SharedDirectory::delete_file(const std::string &name) {
  if (!can_read_file(name)) {
    throw Error("The file is not deletable");
  }
  path p = path_in_dir(name);
  if (!exists(p)) {
    throw Error("The file does not exist");
  }

  uint64_t size = file_size(p);
  indexed_files.erase(indexed_files.find(name));
  remaining_space += size;
  remove(p);
}